

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O1

_Bool borg_think_home_buy_swap_armour(void)

{
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  bool bVar8;
  wchar_t wVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  
  iVar6 = armour_swap_value;
  iVar5 = armour_swap;
  iVar4 = weapon_swap_value;
  iVar3 = weapon_swap;
  if (armour_swap_value < 1 || armour_swap < 1) {
    wVar9 = borg_first_empty_inventory_slot();
    armour_swap_value = -1;
  }
  else {
    wVar9 = armour_swap + L'\xffffffff';
  }
  if (wVar9 == L'\xffffffff') {
    bVar8 = false;
  }
  else {
    iVar13 = armour_swap_value;
    if (z_info->store_inven_max == 0) {
      iVar11 = -1;
      bVar8 = false;
    }
    else {
      iVar11 = -1;
      lVar14 = 0;
      uVar10 = 0;
      bVar8 = false;
      do {
        _Var1 = (borg_shops[7].ware)->curses[lVar14 + -0x26];
        if (_Var1 != false) {
          (borg_shops[7].ware)->curses[lVar14 + -0x26] = (_Bool)(_Var1 + -1);
          memcpy(borg_items + wVar9,(borg_safe_shops[7].ware)->desc + lVar14,0x388);
          borg_items[wVar9].iqty = '\x01';
          borg_notice(true);
          iVar7 = armour_swap_value;
          borg_items[wVar9].iqty = '\0';
          memcpy((borg_shops[7].ware)->desc + lVar14,(borg_safe_shops[7].ware)->desc + lVar14,0x388)
          ;
          iVar12 = iVar13;
          if (iVar13 < iVar7) {
            iVar12 = iVar7;
          }
          if (iVar13 < iVar7) {
            iVar11 = (int)uVar10;
          }
          bVar8 = true;
          iVar13 = iVar12;
        }
        uVar10 = uVar10 + 1;
        lVar14 = lVar14 + 0x388;
      } while (uVar10 < z_info->store_inven_max);
    }
    if (bVar8) {
      borg_notice(true);
    }
    bVar2 = armour_swap_value < iVar13;
    bVar8 = bVar2 && -1 < iVar11;
    weapon_swap = iVar3;
    weapon_swap_value = iVar4;
    armour_swap = iVar5;
    armour_swap_value = iVar6;
    if (bVar2 && -1 < iVar11) {
      borg.goal.shop = 7;
      borg.goal.ware = (int16_t)iVar11;
    }
  }
  return bVar8;
}

Assistant:

bool borg_think_home_buy_swap_armour(void)
{
    int hole;

    int     n, b_n = -1;
    int32_t p, b_p = 0L;
    bool    fix = false;
    int     old_weapon_swap;
    int32_t old_weapon_swap_value;
    int     old_armour_swap;
    int32_t old_armour_swap_value;

    /* save the current values */
    old_weapon_swap       = weapon_swap;
    old_weapon_swap_value = weapon_swap_value;
    old_armour_swap       = armour_swap;
    old_armour_swap_value = armour_swap_value;

    if (armour_swap <= 0 || armour_swap_value <= 0) {
        hole              = borg_first_empty_inventory_slot();
        armour_swap_value = -1L;
    } else {
        hole = armour_swap - 1;
    }

    if (hole == -1)
        return false;

    /* Extract the "power" */
    b_p = armour_swap_value;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Remove one item from shop */
        borg_shops[BORG_HOME].ware[n].iqty--;

        /* Move new item into inventory */
        memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
            sizeof(borg_item));

        /* Only a single item */
        borg_items[hole].iqty = 1;

        /* Fix later */
        fix = true;

        /* Examine the inventory (false)*/
        borg_notice(true);

        /* Evaluate the new equipment */
        p = armour_swap_value;

        /* Restore hole */
        borg_items[hole].iqty = 0;

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and value */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > armour_swap_value)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Restore the values */
        weapon_swap       = old_weapon_swap;
        weapon_swap_value = old_weapon_swap_value;
        armour_swap       = old_armour_swap;
        armour_swap_value = old_armour_swap_value;

        /* Success */
        return true;
    }
    /* Restore the values */
    weapon_swap       = old_weapon_swap;
    weapon_swap_value = old_weapon_swap_value;
    armour_swap       = old_armour_swap;
    armour_swap_value = old_armour_swap_value;

    /* Nope */
    return false;
}